

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_sharing.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  pair<double,_double> pVar5;
  
  dVar4 = 0.0;
  iVar2 = 100;
  dVar3 = 0.0;
  do {
    pVar5 = runBenchmark();
    dVar4 = dVar4 + pVar5.first;
    dVar3 = dVar3 + pVar5.second;
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Close togeher: ",0xf);
  poVar1 = std::ostream::_M_insert<double>(dVar4 / 100.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Far apart: ",0xb);
  poVar1 = std::ostream::_M_insert<double>(dVar3 / 100.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {
  double s1 = 0;
  double s2 = 0;
  for (int i = 0; i != ITERATIONS; ++i) {
    auto p = runBenchmark();
    s1 += p.first;
    s2 += p.second;
  }
  s1 = s1 / ITERATIONS;
  s2 = s2 / ITERATIONS;
  std::cout << "Close togeher: " << s1 << std::endl;
  std::cout << "Far apart: " << s2 << std::endl;
}